

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

string * __thiscall
Diligent::BasicFileSystem::FileDialog_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,FileDialogAttribs *DialogAttribs)

{
  undefined *puVar1;
  undefined8 uVar2;
  allocator local_45 [13];
  undefined1 local_38 [8];
  string _msg;
  FileDialogAttribs *DialogAttribs_local;
  
  _msg.field_2._8_8_ = this;
  FormatString<char[48]>
            ((string *)local_38,(char (*) [48])"File dialog is not implemented on this platform");
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(1,uVar2,0);
  }
  std::__cxx11::string::~string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::FileDialog(const FileDialogAttribs& DialogAttribs)
{
    LOG_WARNING_MESSAGE("File dialog is not implemented on this platform");
    return "";
}